

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_ns.c
# Opt level: O3

int coda_XmlInitEncodingNS(INIT_ENCODING *p,ENCODING **encPtr,char *name)

{
  int iVar1;
  
  iVar1 = getEncodingIndex(name);
  if (iVar1 != -1) {
    (p->initEnc).isUtf16 = (char)iVar1;
    (p->initEnc).scanners[0] = initScanPrologNS;
    (p->initEnc).scanners[1] = initScanContentNS;
    (p->initEnc).updatePosition = initUpdatePosition;
    p->encPtr = encPtr;
    *encPtr = &p->initEnc;
  }
  return (uint)(iVar1 != -1);
}

Assistant:

int
NS(XmlInitEncoding)(INIT_ENCODING *p, const ENCODING **encPtr,
                    const char *name) {
  int i = getEncodingIndex(name);
  if (i == UNKNOWN_ENC)
    return 0;
  SET_INIT_ENC_INDEX(p, i);
  p->initEnc.scanners[XML_PROLOG_STATE] = NS(initScanProlog);
  p->initEnc.scanners[XML_CONTENT_STATE] = NS(initScanContent);
  p->initEnc.updatePosition = initUpdatePosition;
  p->encPtr = encPtr;
  *encPtr = &(p->initEnc);
  return 1;
}